

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_ledger.cpp
# Opt level: O2

int CfdFinalizeTxSerializeHashForLedger
              (void *handle,void *serialize_handle,int net_type,char *tx_hex_string,
              bool skip_witness,bool is_authorization,bool is_sha256,char **serialize_hex)

{
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  LedgerApi api;
  bool is_bitcoin;
  void *local_128;
  string local_120;
  ByteData serialize_data;
  ConfidentialTransactionContext tx;
  
  local_128 = handle;
  cfd::Initialize();
  std::__cxx11::string::string((string *)&tx,"LedgerMetaData",(allocator *)&local_120);
  cfd::capi::CheckBuffer(serialize_handle,(string *)&tx);
  std::__cxx11::string::~string((string *)&tx);
  bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
  if (bVar1) {
    tx.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x4fd529;
    tx.super_ConfidentialTransaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0xcd;
    tx.super_ConfidentialTransaction.vin_.
    super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_7c12ca;
    cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"tx is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&tx,"Failed to parameter. tx is null or empty.",(allocator *)&local_120);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tx);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (serialize_hex == (char **)0x0) {
    tx.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x4fd529;
    tx.super_ConfidentialTransaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0xd3;
    tx.super_ConfidentialTransaction.vin_.
    super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_7c12ca;
    cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"serialize output is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&tx,"Failed to parameter. serialize output is null.",
               (allocator *)&local_120);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tx);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)((long)serialize_handle + 0x10) == 0) {
    tx.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x4fd529;
    tx.super_ConfidentialTransaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0xdc;
    tx.super_ConfidentialTransaction.vin_.
    super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_7c12ca;
    cfd::core::logger::warn<>((CfdSourceLocation *)&tx,"buffer state is illegal.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&tx,"Failed to parameter. buffer state is illegal.",(allocator *)&local_120
              );
    cfd::core::CfdException::CfdException(pCVar3,kCfdOutOfRangeError,(string *)&tx);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::core::ByteData::ByteData(&serialize_data);
  is_bitcoin = false;
  cfd::capi::ConvertNetType(net_type,&is_bitcoin);
  if (is_bitcoin != true) {
    std::__cxx11::string::string((string *)&local_120,tx_hex_string,(allocator *)&api);
    cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&tx,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    cfd::api::LedgerApi::Serialize
              ((ByteData *)&local_120,&api,&tx,
               *(vector<cfd::api::LedgerMetaDataStackItem,_std::allocator<cfd::api::LedgerMetaDataStackItem>_>
                 **)((long)serialize_handle + 0x10),skip_witness,is_authorization);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&serialize_data,&local_120);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_120);
    cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&tx);
    if (is_sha256) {
      cfd::core::HashUtil::Sha256((ByteData256 *)&tx,&serialize_data);
      cfd::core::ByteData256::GetData((ByteData *)&local_120,(ByteData256 *)&tx);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&serialize_data,&local_120
                );
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_120);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tx);
    }
    cfd::core::ByteData::GetHex_abi_cxx11_((string *)&tx,&serialize_data);
    pcVar2 = cfd::capi::CreateString((string *)&tx);
    *serialize_hex = pcVar2;
    std::__cxx11::string::~string((string *)&tx);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&serialize_data);
    return 0;
  }
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&tx,"Bitcoin serialize not implement.",(allocator *)&local_120);
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&tx);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdFinalizeTxSerializeHashForLedger(
    void* handle, void* serialize_handle, int net_type,
    const char* tx_hex_string, bool skip_witness, bool is_authorization,
    bool is_sha256, char** serialize_hex) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(serialize_handle, kPrefixLedgerMetaData);

    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (serialize_hex == nullptr) {
      warn(CFD_LOG_SOURCE, "serialize output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. serialize output is null.");
    }

    CfdCapiLedgerMetaData* buffer =
        static_cast<CfdCapiLedgerMetaData*>(serialize_handle);
    if (buffer->metadata_stack == nullptr) {
      warn(CFD_LOG_SOURCE, "buffer state is illegal.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. buffer state is illegal.");
    }

    ByteData serialize_data;
    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    if (is_bitcoin) {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Bitcoin serialize not implement.");
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex_string);
      LedgerApi api;
      serialize_data = api.Serialize(
          tx, *(buffer->metadata_stack), skip_witness, is_authorization);
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }
    if (is_sha256) {
      ByteData256 hashed_data = HashUtil::Sha256(serialize_data);
      serialize_data = hashed_data.GetData();
    }
    *serialize_hex = CreateString(serialize_data.GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}